

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O0

LIBSSH2_CHANNEL *
scp_send(LIBSSH2_SESSION *session,char *path,int mode,libssh2_int64_t size,time_t mtime,time_t atime
        )

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uchar *puVar5;
  LIBSSH2_CHANNEL *pLVar6;
  ssize_t sVar7;
  size_t buflen;
  char *pcVar8;
  char *err_msg;
  size_t err_len;
  char *base;
  char *tmp_err_msg;
  int tmp_err_code;
  int rc;
  int cmd_len;
  time_t atime_local;
  time_t mtime_local;
  libssh2_int64_t size_local;
  int mode_local;
  char *path_local;
  LIBSSH2_SESSION *session_local;
  
  if (session->scpSend_state == libssh2_NB_state_idle) {
    sVar4 = strlen(path);
    session->scpSend_command_len = sVar4 * 3 + 10 + (long)(int)(uint)(mtime != 0 || atime != 0);
    puVar5 = (uchar *)(*session->alloc)(session->scpSend_command_len,&session->abstract);
    session->scpSend_command = puVar5;
    if (session->scpSend_command == (uchar *)0x0) {
      _libssh2_error(session,-6,"Unable to allocate a command buffer for SCP session");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    pcVar8 = "";
    if (mtime != 0 || atime != 0) {
      pcVar8 = "p";
    }
    snprintf((char *)session->scpSend_command,session->scpSend_command_len,"scp -%st ",pcVar8);
    sVar4 = strlen((char *)session->scpSend_command);
    iVar2 = (int)sVar4;
    uVar1 = shell_quotearg(path,session->scpSend_command + iVar2,
                           (int)session->scpSend_command_len - iVar2);
    session->scpSend_command[(int)(uVar1 + iVar2)] = '\0';
    session->scpSend_command_len = (long)(int)(uVar1 + iVar2 + 1);
    session->scpSend_state = libssh2_NB_state_created;
  }
  if (session->scpSend_state == libssh2_NB_state_created) {
    pLVar6 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
    session->scpSend_channel = pLVar6;
    if (session->scpSend_channel == (LIBSSH2_CHANNEL *)0x0) {
      iVar2 = libssh2_session_last_errno(session);
      if (iVar2 == -0x25) {
        _libssh2_error(session,-0x25,"Would block starting up channel");
      }
      else {
        (*session->free)(session->scpSend_command,&session->abstract);
        session->scpSend_command = (uchar *)0x0;
        session->scpSend_state = libssh2_NB_state_idle;
      }
      return (LIBSSH2_CHANNEL *)0x0;
    }
    session->scpSend_state = libssh2_NB_state_sent;
  }
  if (session->scpSend_state == libssh2_NB_state_sent) {
    iVar2 = _libssh2_channel_process_startup
                      (session->scpSend_channel,"exec",4,(char *)session->scpSend_command,
                       session->scpSend_command_len);
    if (iVar2 == -0x25) {
      _libssh2_error(session,-0x25,"Would block requesting SCP startup");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    if (iVar2 != 0) {
      (*session->free)(session->scpSend_command,&session->abstract);
      session->scpSend_command = (uchar *)0x0;
      _libssh2_error(session,-0x1c,"Unknown error while getting error string");
      goto LAB_00129693;
    }
    (*session->free)(session->scpSend_command,&session->abstract);
    session->scpSend_command = (uchar *)0x0;
    session->scpSend_state = libssh2_NB_state_sent1;
  }
  if (session->scpSend_state == libssh2_NB_state_sent1) {
    sVar7 = _libssh2_channel_read(session->scpSend_channel,0,(char *)session->scpSend_response,1);
    iVar2 = (int)sVar7;
    if (iVar2 == -0x25) {
      _libssh2_error(session,-0x25,"Would block waiting for response from remote");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    if (iVar2 < 0) {
      _libssh2_error(session,iVar2,"SCP failure");
      goto LAB_00129693;
    }
    if (iVar2 != 0) {
      if (session->scpSend_response[0] != '\0') {
        _libssh2_error(session,-0x1c,"Invalid ACK response from remote");
        goto LAB_00129693;
      }
      if ((mtime != 0) || (atime != 0)) {
        iVar2 = snprintf((char *)session->scpSend_response,0x100,"T%ld 0 %ld 0\n",mtime,atime);
        session->scpSend_response_len = (long)iVar2;
      }
      session->scpSend_state = libssh2_NB_state_sent2;
      goto LAB_00129227;
    }
  }
  else {
LAB_00129227:
    if ((mtime == 0) && (atime == 0)) {
      if (session->scpSend_state == libssh2_NB_state_sent2) {
        session->scpSend_state = libssh2_NB_state_sent4;
      }
    }
    else {
      if (session->scpSend_state == libssh2_NB_state_sent2) {
        sVar7 = _libssh2_channel_write
                          (session->scpSend_channel,0,session->scpSend_response,
                           session->scpSend_response_len);
        if ((int)sVar7 == -0x25) {
          _libssh2_error(session,-0x25,"Would block sending time data for SCP file");
          return (LIBSSH2_CHANNEL *)0x0;
        }
        if ((int)sVar7 != (int)session->scpSend_response_len) {
          _libssh2_error(session,-7,"Unable to send time data for SCP file");
          goto LAB_00129693;
        }
        session->scpSend_state = libssh2_NB_state_sent3;
      }
      if (session->scpSend_state == libssh2_NB_state_sent3) {
        sVar7 = _libssh2_channel_read
                          (session->scpSend_channel,0,(char *)session->scpSend_response,1);
        iVar2 = (int)sVar7;
        if (iVar2 == -0x25) {
          _libssh2_error(session,-0x25,"Would block waiting for response");
          return (LIBSSH2_CHANNEL *)0x0;
        }
        if (iVar2 < 0) {
          _libssh2_error(session,iVar2,"SCP failure");
          goto LAB_00129693;
        }
        if (iVar2 == 0) goto LAB_00129654;
        if (session->scpSend_response[0] != '\0') {
          _libssh2_error(session,-0x1c,"Invalid SCP ACK response");
          goto LAB_00129693;
        }
        session->scpSend_state = libssh2_NB_state_sent4;
      }
    }
    if (session->scpSend_state == libssh2_NB_state_sent4) {
      pcVar8 = strrchr(path,0x2f);
      err_len = (size_t)path;
      if (pcVar8 != (char *)0x0) {
        err_len = (size_t)(pcVar8 + 1);
      }
      iVar2 = snprintf((char *)session->scpSend_response,0x100,"C0%o %lld %s\n",(ulong)(uint)mode,
                       size,err_len);
      session->scpSend_response_len = (long)iVar2;
      session->scpSend_state = libssh2_NB_state_sent5;
    }
    if (session->scpSend_state == libssh2_NB_state_sent5) {
      sVar7 = _libssh2_channel_write
                        (session->scpSend_channel,0,session->scpSend_response,
                         session->scpSend_response_len);
      if ((int)sVar7 == -0x25) {
        _libssh2_error(session,-0x25,"Would block send core file data for SCP file");
        return (LIBSSH2_CHANNEL *)0x0;
      }
      if ((int)sVar7 != (int)session->scpSend_response_len) {
        _libssh2_error(session,-7,"Unable to send core file data for SCP file");
        goto LAB_00129693;
      }
      session->scpSend_state = libssh2_NB_state_sent6;
    }
    if (session->scpSend_state != libssh2_NB_state_sent6) {
LAB_00129632:
      session->scpSend_state = libssh2_NB_state_idle;
      return session->scpSend_channel;
    }
    sVar7 = _libssh2_channel_read(session->scpSend_channel,0,(char *)session->scpSend_response,1);
    iVar2 = (int)sVar7;
    if (iVar2 == -0x25) {
      _libssh2_error(session,-0x25,"Would block waiting for response");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    if (iVar2 < 0) {
      _libssh2_error(session,-0x1c,"Invalid ACK response from remote");
      goto LAB_00129693;
    }
    if (iVar2 != 0) {
      if (session->scpSend_response[0] == '\0') goto LAB_00129632;
      buflen = _libssh2_channel_packet_data_len(session->scpSend_channel,0);
      pcVar8 = (char *)(*session->alloc)(buflen + 1,&session->abstract);
      if (pcVar8 == (char *)0x0) {
        _libssh2_error(session,-6,"failed to get memory");
      }
      else {
        sVar7 = _libssh2_channel_read(session->scpSend_channel,0,pcVar8,buflen);
        if (0 < (int)sVar7) {
          pcVar8[buflen] = '\0';
        }
        (*session->free)(pcVar8,&session->abstract);
        _libssh2_error(session,-0x1c,"failed to send file");
      }
      goto LAB_00129693;
    }
  }
LAB_00129654:
  iVar2 = libssh2_channel_eof(session->scpSend_channel);
  if (iVar2 == 0) {
    return session->scpSend_channel;
  }
  _libssh2_error(session,-0x1c,"Unexpected channel close");
LAB_00129693:
  iVar2 = session->err_code;
  pcVar8 = session->err_msg;
  do {
    iVar3 = libssh2_channel_free(session->scpSend_channel);
  } while (iVar3 == -0x25);
  session->err_code = iVar2;
  session->err_msg = pcVar8;
  session->scpSend_channel = (LIBSSH2_CHANNEL *)0x0;
  session->scpSend_state = libssh2_NB_state_idle;
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

static LIBSSH2_CHANNEL *
scp_send(LIBSSH2_SESSION * session, const char *path, int mode,
         libssh2_int64_t size, time_t mtime, time_t atime)
{
    int cmd_len;
    int rc;
    int tmp_err_code;
    const char *tmp_err_msg;

    if (session->scpSend_state == libssh2_NB_state_idle) {
        session->scpSend_command_len =
            _libssh2_shell_quotedsize(path) + sizeof("scp -t ") +
            ((mtime || atime)?1:0);

        session->scpSend_command =
            LIBSSH2_ALLOC(session, session->scpSend_command_len);

        if (!session->scpSend_command) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a command buffer for "
                           "SCP session");
            return NULL;
        }

        snprintf((char *)session->scpSend_command,
                 session->scpSend_command_len,
                 "scp -%st ", (mtime || atime)?"p":"");

        cmd_len = strlen((char *)session->scpSend_command);
        cmd_len += shell_quotearg(path,
                                  &session->scpSend_command[cmd_len],
                                  session->scpSend_command_len - cmd_len);

        session->scpSend_command[cmd_len] = '\0';
        session->scpSend_command_len = cmd_len + 1;

        _libssh2_debug(session, LIBSSH2_TRACE_SCP,
                       "Opening channel for SCP send");
        /* Allocate a channel */

        session->scpSend_state = libssh2_NB_state_created;
    }

    if (session->scpSend_state == libssh2_NB_state_created) {
        session->scpSend_channel =
            _libssh2_channel_open(session, "session", sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL, 0);
        if (!session->scpSend_channel) {
            if (libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
                /* previous call set libssh2_session_last_error(), pass it
                   through */
                LIBSSH2_FREE(session, session->scpSend_command);
                session->scpSend_command = NULL;
                session->scpSend_state = libssh2_NB_state_idle;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block starting up channel");
            }
            return NULL;
        }

        session->scpSend_state = libssh2_NB_state_sent;
    }

    if (session->scpSend_state == libssh2_NB_state_sent) {
        /* Request SCP for the desired file */
        rc = _libssh2_channel_process_startup(session->scpSend_channel, "exec",
                                              sizeof("exec") - 1,
                                              (char *) session->scpSend_command,
                                              session->scpSend_command_len);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting SCP startup");
            return NULL;
        }
        else if (rc) {
            /* previous call set libssh2_session_last_error(), pass it
               through */
            LIBSSH2_FREE(session, session->scpSend_command);
            session->scpSend_command = NULL;
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "Unknown error while getting error string");
            goto scp_send_error;
        }
        LIBSSH2_FREE(session, session->scpSend_command);
        session->scpSend_command = NULL;

        session->scpSend_state = libssh2_NB_state_sent1;
    }

    if (session->scpSend_state == libssh2_NB_state_sent1) {
        /* Wait for ACK */
        rc = _libssh2_channel_read(session->scpSend_channel, 0,
                                   (char *) session->scpSend_response, 1);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block waiting for response from remote");
            return NULL;
        }
        else if (rc < 0) {
            _libssh2_error(session, rc, "SCP failure");
            goto scp_send_error;
        }
        else if(!rc)
            /* remain in the same state */
            goto scp_send_empty_channel;
        else if (session->scpSend_response[0] != 0) {
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "Invalid ACK response from remote");
            goto scp_send_error;
        }
        if (mtime || atime) {
            /* Send mtime and atime to be used for file */
            session->scpSend_response_len =
                snprintf((char *) session->scpSend_response,
                         LIBSSH2_SCP_RESPONSE_BUFLEN, "T%ld 0 %ld 0\n",
                         (long)mtime, (long)atime);
            _libssh2_debug(session, LIBSSH2_TRACE_SCP, "Sent %s",
                           session->scpSend_response);
        }

        session->scpSend_state = libssh2_NB_state_sent2;
    }

    /* Send mtime and atime to be used for file */
    if (mtime || atime) {
        if (session->scpSend_state == libssh2_NB_state_sent2) {
            rc = _libssh2_channel_write(session->scpSend_channel, 0,
                                        session->scpSend_response,
                                        session->scpSend_response_len);
            if (rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block sending time data for SCP file");
                return NULL;
            } else if (rc != (int)session->scpSend_response_len) {
                _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                               "Unable to send time data for SCP file");
                goto scp_send_error;
            }

            session->scpSend_state = libssh2_NB_state_sent3;
        }

        if (session->scpSend_state == libssh2_NB_state_sent3) {
            /* Wait for ACK */
            rc = _libssh2_channel_read(session->scpSend_channel, 0,
                                       (char *) session->scpSend_response, 1);
            if (rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block waiting for response");
                return NULL;
            }
            else if (rc < 0) {
                _libssh2_error(session, rc, "SCP failure");
                goto scp_send_error;
            }
            else if(!rc)
                /* remain in the same state */
                goto scp_send_empty_channel;
            else if (session->scpSend_response[0] != 0) {
                _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                               "Invalid SCP ACK response");
                goto scp_send_error;
            }

            session->scpSend_state = libssh2_NB_state_sent4;
        }
    } else {
        if (session->scpSend_state == libssh2_NB_state_sent2) {
            session->scpSend_state = libssh2_NB_state_sent4;
        }
    }

    if (session->scpSend_state == libssh2_NB_state_sent4) {
        /* Send mode, size, and basename */
        const char *base = strrchr(path, '/');
        if (base)
            base++;
        else
            base = path;

        session->scpSend_response_len =
            snprintf((char *) session->scpSend_response,
                     LIBSSH2_SCP_RESPONSE_BUFLEN, "C0%o %"
                     LIBSSH2_INT64_T_FORMAT " %s\n", mode,
                     size, base);
        _libssh2_debug(session, LIBSSH2_TRACE_SCP, "Sent %s",
                       session->scpSend_response);

        session->scpSend_state = libssh2_NB_state_sent5;
    }

    if (session->scpSend_state == libssh2_NB_state_sent5) {
        rc = _libssh2_channel_write(session->scpSend_channel, 0,
                                    session->scpSend_response,
                                    session->scpSend_response_len);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block send core file data for SCP file");
            return NULL;
        } else if (rc != (int)session->scpSend_response_len) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send core file data for SCP file");
            goto scp_send_error;
        }

        session->scpSend_state = libssh2_NB_state_sent6;
    }

    if (session->scpSend_state == libssh2_NB_state_sent6) {
        /* Wait for ACK */
        rc = _libssh2_channel_read(session->scpSend_channel, 0,
                                   (char *) session->scpSend_response, 1);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block waiting for response");
            return NULL;
        }
        else if (rc < 0) {
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "Invalid ACK response from remote");
            goto scp_send_error;
        }
        else if (rc == 0)
            goto scp_send_empty_channel;

        else if (session->scpSend_response[0] != 0) {
            size_t err_len;
            char *err_msg;

            err_len =
                _libssh2_channel_packet_data_len(session->scpSend_channel, 0);
            err_msg = LIBSSH2_ALLOC(session, err_len + 1);
            if (!err_msg) {
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                               "failed to get memory");
                goto scp_send_error;
            }

            /* Read the remote error message */
            rc = _libssh2_channel_read(session->scpSend_channel, 0,
                                       err_msg, err_len);
            if (rc > 0) {
                err_msg[err_len]=0;
                _libssh2_debug(session, LIBSSH2_TRACE_SCP,
                               "got %02x %s", session->scpSend_response[0],
                               err_msg);
            }
            LIBSSH2_FREE(session, err_msg);
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "failed to send file");
            goto scp_send_error;
        }
    }

    session->scpSend_state = libssh2_NB_state_idle;
    return session->scpSend_channel;

  scp_send_empty_channel:
    /* the code only jumps here as a result of a zero read from channel_read()
       so we check EOF status to avoid getting stuck in a loop */
    if(libssh2_channel_eof(session->scpSend_channel)) {
        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                       "Unexpected channel close");
    }
    else
        return session->scpSend_channel;
    /* fall-through */
  scp_send_error:
    tmp_err_code = session->err_code;
    tmp_err_msg = session->err_msg;
    while (libssh2_channel_free(session->scpSend_channel) ==
           LIBSSH2_ERROR_EAGAIN);
    session->err_code = tmp_err_code;
    session->err_msg = tmp_err_msg;
    session->scpSend_channel = NULL;
    session->scpSend_state = libssh2_NB_state_idle;
    return NULL;
}